

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue<unsigned_int>
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,uint *item)

{
  __int_type_conflict _Var1;
  __int_type_conflict _Var2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  ulong uVar4;
  bool bVar5;
  __pointer_type pPVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ProducerBase *pPVar10;
  __pointer_type this_00;
  bool bVar11;
  
  pPVar6 = (this->producerListTail)._M_b._M_p;
  uVar7 = 0;
  this_00 = (ProducerBase *)0x0;
  uVar8 = 0;
  while ((uVar7 < 3 && (pPVar6 != (__pointer_type)0x0))) {
    _Var1 = (pPVar6->tailIndex).super___atomic_base<unsigned_long>._M_i;
    _Var2 = (pPVar6->headIndex).super___atomic_base<unsigned_long>._M_i;
    uVar9 = _Var1 - _Var2;
    if (_Var2 - _Var1 < 0x8000000000000001) {
      uVar9 = 0;
    }
    pPVar10 = this_00;
    uVar4 = uVar8;
    if (uVar8 < uVar9) {
      pPVar10 = pPVar6;
      uVar4 = uVar9;
    }
    if (uVar9 != 0) {
      uVar8 = uVar4;
      this_00 = pPVar10;
    }
    uVar7 = uVar7 + (uVar9 != 0);
    pCVar3 = (pPVar6->super_ConcurrentQueueProducerTypelessBase).next;
    pPVar6 = (__pointer_type)&pCVar3[-1].token;
    if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      pPVar6 = (__pointer_type)0x0;
    }
  }
  if (uVar7 == 0) {
    bVar11 = false;
  }
  else {
    bVar5 = ProducerBase::dequeue<unsigned_int>(this_00,item);
    bVar11 = true;
    if (!bVar5) {
      pPVar6 = (this->producerListTail)._M_b._M_p;
      while ((bVar11 = pPVar6 != (ProducerBase *)0x0, bVar11 &&
             ((pPVar6 == this_00 ||
              (bVar5 = ProducerBase::dequeue<unsigned_int>(pPVar6,item), !bVar5))))) {
        pCVar3 = (pPVar6->super_ConcurrentQueueProducerTypelessBase).next;
        pPVar6 = (__pointer_type)&pCVar3[-1].token;
        if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pPVar6 = (ProducerBase *)0x0;
        }
      }
    }
  }
  return bVar11;
}

Assistant:

bool try_dequeue(U& item)
	{
		// Instead of simply trying each producer in turn (which could cause needless contention on the first
		// producer), we score them heuristically.
		size_t nonEmptyCount = 0;
		ProducerBase* best = nullptr;
		size_t bestSize = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
			auto size = ptr->size_approx();
			if (size > 0) {
				if (size > bestSize) {
					bestSize = size;
					best = ptr;
				}
				++nonEmptyCount;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (nonEmptyCount > 0) {
			if (details::likely(best->dequeue(item))) {
				return true;
			}
			for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
				if (ptr != best && ptr->dequeue(item)) {
					return true;
				}
			}
		}
		return false;
	}